

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O1

string * getWord(string *__return_storage_ptr__,string *str,unsigned_long *pos)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  while ((uVar2 = (ulong)(byte)(str->_M_dataplus)._M_p[lVar1 + *pos], 0x29 < uVar2 ||
         ((0x20100000600U >> (uVar2 & 0x3f) & 1) == 0))) {
    lVar1 = lVar1 + 1;
  }
  *pos = *pos + lVar1;
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return __return_storage_ptr__;
}

Assistant:

std::string getWord(const std::string &str, unsigned long &pos) {
    unsigned long count = 0;
    auto begin = pos;
    while (!isBlank(str[pos + count]) && str[pos + count] != ')') {
        count++;
    }
    pos += count;
    return str.substr(begin, count);
}